

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

void tinyformat::format<std::__cxx11::string,char[17]>
               (ostream *out,char *fmt,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
               char (*args_1) [17])

{
  long lVar1;
  ostream *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  FormatListRef in_stack_ffffffffffffff78;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  makeFormatList<std::__cxx11::string,char[17]>(in_RDI,(char (*) [17])in_stack_ffffffffffffff78);
  vformat(in_RSI,(char *)in_RDI,in_stack_ffffffffffffff78);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}